

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeTriang>::InitMaterialDataT<std::complex<double>>
          (TPZCompElHDivCollapsed<pzshape::TPZShapeTriang> *this,
          TPZMaterialDataT<std::complex<double>_> *data)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  TPZCompMesh *pTVar5;
  TPZConnect *this_00;
  uint *puVar6;
  int *piVar7;
  TPZManVector<long,_3> *this_01;
  long *plVar8;
  long *in_RDI;
  TPZCompEl *in_stack_00000030;
  int i_2;
  TPZManVector<long,_3> ids;
  TPZGeoEl *gel;
  int i_1;
  TPZManVector<int,_10> sideorient;
  int i;
  TPZManVector<int,_10> connectorders;
  int ncon;
  int dim;
  int64_t nvecshapecollpased;
  int bottomorder;
  int toporder;
  TPZConnect *conntop;
  TPZConnect *connbot;
  TPZShapeData *shapedata;
  TPZShapeData *in_stack_00007358;
  TPZVec<int> *in_stack_00007360;
  TPZVec<int> *in_stack_00007368;
  TPZVec<long> *in_stack_00007370;
  undefined8 in_stack_fffffffffffffe48;
  TPZCompElHDiv<pzshape::TPZShapeTriang> *in_stack_fffffffffffffe50;
  TPZCompEl *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  TPZChunkVector<TPZConnect,_10> *in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  TPZManVector<int,_10> *in_stack_fffffffffffffe80;
  int local_134;
  TPZVec<long> local_130;
  TPZGeoEl *local_f8;
  int local_f0;
  undefined4 local_ec;
  TPZVec<int> local_e8 [2];
  int local_90;
  undefined4 local_8c;
  TPZVec<int> local_88 [2];
  int local_40;
  undefined4 local_3c;
  long local_38;
  uint local_30;
  uint local_2c;
  TPZConnect *local_28;
  TPZConnect *local_20;
  
  pTVar5 = TPZCompEl::Mesh(in_stack_00000030);
  TPZCompMesh::ConnectVec(pTVar5);
  local_20 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (in_stack_fffffffffffffe70,
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  pTVar5 = TPZCompEl::Mesh(in_stack_00000030);
  TPZCompMesh::ConnectVec(pTVar5);
  local_28 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (in_stack_fffffffffffffe70,
                        CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  bVar3 = TPZConnect::Order(local_28);
  local_2c = (uint)bVar3;
  bVar3 = TPZConnect::Order(local_20);
  local_30 = (uint)bVar3;
  iVar4 = (**(code **)(*in_RDI + 600))();
  local_38 = (long)iVar4;
  local_3c = 3;
  local_40 = (**(code **)(*in_RDI + 0x90))();
  local_8c = 0;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffffe80,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
             ,(int *)in_stack_fffffffffffffe70);
  for (local_90 = 0; uVar1 = local_30, local_90 < 4; local_90 = local_90 + 1) {
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_90);
    bVar3 = TPZConnect::Order(this_00);
    puVar6 = (uint *)TPZVec<int>::operator[](local_88,(long)local_90);
    *puVar6 = (uint)bVar3;
  }
  puVar6 = (uint *)TPZVec<int>::operator[](local_88,(long)(local_40 + -2));
  uVar2 = local_2c;
  *puVar6 = uVar1;
  puVar6 = (uint *)TPZVec<int>::operator[](local_88,(long)(local_40 + -1));
  *puVar6 = uVar2;
  local_ec = 0;
  TPZManVector<int,_10>::TPZManVector
            (in_stack_fffffffffffffe80,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78)
             ,(int *)in_stack_fffffffffffffe70);
  for (local_f0 = 0; local_f0 < 3; local_f0 = local_f0 + 1) {
    iVar4 = TPZCompElHDiv<pzshape::TPZShapeTriang>::SideOrient
                      (in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20));
    piVar7 = TPZVec<int>::operator[](local_e8,(long)local_f0);
    *piVar7 = iVar4;
  }
  iVar4 = (**(code **)(*in_RDI + 0x2f0))(in_RDI,6);
  this_01 = (TPZManVector<long,_3> *)TPZVec<int>::operator[](local_e8,3);
  *(int *)&(this_01->super_TPZVec<long>)._vptr_TPZVec = iVar4;
  iVar4 = (**(code **)(*in_RDI + 0x2f0))(in_RDI,7);
  piVar7 = TPZVec<int>::operator[](local_e8,4);
  *piVar7 = iVar4;
  local_f8 = TPZCompEl::Reference(in_stack_fffffffffffffe58);
  TPZManVector<long,_3>::TPZManVector(this_01,CONCAT44(iVar4,in_stack_fffffffffffffe68));
  for (local_134 = 0; local_134 < 3; local_134 = local_134 + 1) {
    in_stack_fffffffffffffe50 =
         (TPZCompElHDiv<pzshape::TPZShapeTriang> *)
         (**(code **)(*(long *)local_f8 + 0xa8))(local_f8,local_134);
    plVar8 = TPZVec<long>::operator[](&local_130,(long)local_134);
    *plVar8 = (long)in_stack_fffffffffffffe50;
  }
  TPZShapeHDivCollapsed<pzshape::TPZShapeTriang>::Initialize
            (in_stack_00007370,in_stack_00007368,in_stack_00007360,in_stack_00007358);
  TPZManVector<long,_3>::~TPZManVector((TPZManVector<long,_3> *)in_stack_fffffffffffffe50);
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffffe50);
  TPZManVector<int,_10>::~TPZManVector((TPZManVector<int,_10> *)in_stack_fffffffffffffe50);
  return;
}

Assistant:

void TPZCompElHDivCollapsed<TSHAPE>::InitMaterialDataT(TPZMaterialDataT<TVar> &data)
{
    TPZShapeData& shapedata = data;
    
    // Order of top and bot connect
    TPZConnect& connbot = this->Mesh()->ConnectVec()[fbottom_c_index];
    TPZConnect& conntop = this->Mesh()->ConnectVec()[ftop_c_index];
    const int toporder = conntop.Order();
    const int bottomorder = connbot.Order();
    
    // Number of shape and dim
    const int64_t nvecshapecollpased = this->NShapeF();
    const int dim = TSHAPE::Dimension+1;
    
    // Order of connects
    int ncon = NConnects();
    TPZManVector<int> connectorders(ncon,0);
    for(int i=0; i<TSHAPE::NFacets+1; i++) connectorders[i] = this->Connect(i).Order();
    connectorders[ncon-2] = bottomorder;
    connectorders[ncon-1] = toporder;
    
    // Side orient
    TPZManVector<int> sideorient(TSHAPE::NFacets+2,0);
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    sideorient[TSHAPE::NFacets] = GetSideOrient(TSHAPE::NSides-1);
    sideorient[TSHAPE::NFacets+1] = GetSideOrient(TSHAPE::NSides);
    
    // Node ids of geoel
    TPZGeoEl *gel = this->Reference();
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodeIndex(i);
    
    // Init shape data
    TPZShapeHDivCollapsed<TSHAPE>::Initialize(ids, connectorders, sideorient, shapedata);

#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
        std::stringstream sout;
        sout << "After InitMaterialData\n";
        data.Print(sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
    
}